

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS
ref_interp_integrate
          (REF_GRID ref_grid,REF_DBL *candidate,REF_DBL *truth,REF_INT norm_power,REF_DBL *error)

{
  REF_CELL ref_cell;
  REF_STATUS RVar1;
  uint uVar2;
  long lVar3;
  int cell;
  long lVar4;
  double dVar5;
  double dVar6;
  REF_DBL total_volume;
  REF_INT part;
  REF_DBL volume;
  REF_DBL bary [4];
  REF_INT nodes [27];
  double local_100;
  REF_MPI local_f8;
  REF_INT local_f0;
  int local_ec;
  REF_NODE local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8 [4];
  REF_INT local_a8 [30];
  
  local_f8 = ref_grid->mpi;
  local_e8 = ref_grid->node;
  ref_cell = ref_grid->cell[8];
  *error = 0.0;
  local_100 = 0.0;
  local_f0 = norm_power;
  if (0 < ref_cell->max) {
    local_d8 = (double)norm_power;
    cell = 0;
    do {
      RVar1 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (RVar1 == 0) {
        uVar2 = ref_cell_part(ref_cell,local_e8,cell,&local_ec);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0xa1e,"ref_interp_integrate",(ulong)uVar2,"owner");
          return uVar2;
        }
        if (local_ec == local_f8->id) {
          uVar2 = ref_node_tet_vol(local_e8,local_a8,&local_e0);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0xa20,"ref_interp_integrate",(ulong)uVar2,"vol");
            return uVar2;
          }
          local_100 = local_e0 + local_100;
          lVar4 = 0;
          do {
            local_c8[1] = (xq[lVar4] + 1.0) * 0.5;
            local_c8[2] = (yq[lVar4] + 1.0) * 0.5;
            local_c8[3] = (zq[lVar4] + 1.0) * 0.5;
            local_c8[0] = ((1.0 - local_c8[1]) - local_c8[2]) - local_c8[3];
            if ((long)ref_cell->node_per < 1) {
              dVar5 = 0.0;
            }
            else {
              dVar6 = 0.0;
              lVar3 = 0;
              dVar5 = 0.0;
              do {
                dVar5 = dVar5 + candidate[local_a8[lVar3]] * local_c8[lVar3];
                dVar6 = dVar6 + local_c8[lVar3] * truth[local_a8[lVar3]];
                lVar3 = lVar3 + 1;
              } while (ref_cell->node_per != lVar3);
              dVar5 = dVar5 - dVar6;
            }
            if (dVar5 <= -dVar5) {
              dVar5 = -dVar5;
            }
            local_d0 = wq[lVar4] * 0.75 * local_e0;
            dVar5 = pow(dVar5,local_d8);
            *error = dVar5 * local_d0 + *error;
            lVar4 = lVar4 + 1;
          } while (lVar4 != 0x18);
        }
      }
      cell = cell + 1;
    } while (cell < ref_cell->max);
  }
  uVar2 = ref_mpi_allsum(local_f8,error,1,3);
  if (uVar2 == 0) {
    dVar5 = pow(*error,1.0 / (double)local_f0);
    *error = dVar5;
    uVar2 = ref_mpi_allsum(local_f8,&local_100,1,3);
    if (uVar2 == 0) {
      *error = *error / local_100;
      uVar2 = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0xa34,"ref_interp_integrate",(ulong)uVar2,"all sum");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0xa32,
           "ref_interp_integrate",(ulong)uVar2,"all sum");
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_interp_integrate(REF_GRID ref_grid, REF_DBL *candidate,
                                        REF_DBL *truth, REF_INT norm_power,
                                        REF_DBL *error) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT i, cell, cell_node, node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL diff, volume, total_volume, bary[4];
  REF_DBL candidate_at_gauss_point, truth_at_gauss_point;
  REF_INT part;
  *error = 0.0;
  total_volume = 0.0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "owner");
    if (part != ref_mpi_rank(ref_mpi)) continue;
    RSS(ref_node_tet_vol(ref_node, nodes, &volume), "vol");
    total_volume += volume;
    for (i = 0; i < nq; i++) {
      bary[1] = 0.5 * (1.0 + xq[i]);
      bary[2] = 0.5 * (1.0 + yq[i]);
      bary[3] = 0.5 * (1.0 + zq[i]);
      bary[0] = 1.0 - bary[1] - bary[2] - bary[3];
      candidate_at_gauss_point = 0.0;
      truth_at_gauss_point = 0.0;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        node = nodes[cell_node];
        candidate_at_gauss_point += bary[cell_node] * candidate[node];
        truth_at_gauss_point += bary[cell_node] * truth[node];
      }
      diff = ABS(candidate_at_gauss_point - truth_at_gauss_point);
      *error += (6.0 / 8.0) * wq[i] * volume * pow(diff, norm_power);
    }
  }
  RSS(ref_mpi_allsum(ref_mpi, error, 1, REF_DBL_TYPE), "all sum");
  *error = pow(*error, 1.0 / ((REF_DBL)norm_power));
  RSS(ref_mpi_allsum(ref_mpi, &total_volume, 1, REF_DBL_TYPE), "all sum");
  *error /= total_volume;
  return REF_SUCCESS;
}